

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

ScalarFunction * duckdb::CosFun::GetFunction(void)

{
  initializer_list<duckdb::LogicalType> iVar1;
  ScalarFunction *in_RDI;
  ScalarFunction *function;
  allocator_type *in_stack_fffffffffffffe08;
  BaseScalarFunction *function_00;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffe10;
  BaseScalarFunction *this;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  LogicalTypeId in_stack_fffffffffffffe2f;
  LogicalType *in_stack_fffffffffffffe30;
  undefined1 **local_188;
  bind_scalar_function_extended_t in_stack_ffffffffffffff30;
  bind_scalar_function_t in_stack_ffffffffffffff38;
  scalar_function_t *in_stack_ffffffffffffff40;
  LogicalType *in_stack_ffffffffffffff48;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffff50;
  ScalarFunction *in_stack_ffffffffffffff58;
  function_statistics_t in_stack_ffffffffffffff90;
  init_local_state_t in_stack_ffffffffffffff98;
  LogicalType *in_stack_ffffffffffffffa0;
  FunctionStability side_effects;
  FunctionNullHandling in_stack_ffffffffffffffb0;
  bind_lambda_function_t in_stack_ffffffffffffffb8;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_9;
  
  local_9 = 0;
  side_effects = (FunctionStability)&stack0xffffffffffffffb0;
  LogicalType::LogicalType(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2f);
  local_38 = &stack0xffffffffffffffb0;
  local_30 = 1;
  ::std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x2079ba4);
  iVar1._M_len._0_4_ = in_stack_fffffffffffffe20;
  iVar1._M_array = (iterator)in_stack_fffffffffffffe18;
  iVar1._M_len._4_4_ = in_stack_fffffffffffffe24;
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffffe10,iVar1,in_stack_fffffffffffffe08);
  LogicalType::LogicalType(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2f);
  ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),in_stack_fffffffffffffe18
            );
  LogicalType::LogicalType(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2f);
  this = (BaseScalarFunction *)0x0;
  function_00 = (BaseScalarFunction *)0x0;
  ScalarFunction::ScalarFunction
            (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
             in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
             in_stack_ffffffffffffff90,in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0,
             side_effects,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8);
  LogicalType::~LogicalType((LogicalType *)0x2079c71);
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
  ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
            0x2079c7e);
  LogicalType::~LogicalType((LogicalType *)0x2079c8b);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x2079c98);
  ::std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x2079ca5);
  local_188 = &local_38;
  do {
    local_188 = local_188 + -3;
    LogicalType::~LogicalType((LogicalType *)0x2079cce);
  } while (local_188 != (undefined1 **)&stack0xffffffffffffffb0);
  BaseScalarFunction::SetReturnsError(function_00);
  BaseScalarFunction::~BaseScalarFunction(this);
  return in_RDI;
}

Assistant:

ScalarFunction CosFun::GetFunction() {
	ScalarFunction function({LogicalType::DOUBLE}, LogicalType::DOUBLE,
	                        ScalarFunction::UnaryFunction<double, double, NoInfiniteDoubleWrapper<CosOperator>>);
	BaseScalarFunction::SetReturnsError(function);
	return function;
}